

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

idx_t duckdb::SortKeyConstantOperator<double>::Encode(data_ptr_t result,TYPE_conflict2 input)

{
  bool bVar1;
  ulong uVar2;
  
  if ((input != 0.0) || (NAN(input))) {
    bVar1 = Value::IsNan<double>(input);
    uVar2 = 0xffffffffffffffff;
    if ((!bVar1) && (uVar2 = 0xfffffffffffffffe, input <= 1.79769313486232e+308)) {
      if (-1.79769313486232e+308 <= input) {
        uVar2 = ~(ulong)input;
        if (-1 < (long)input) {
          uVar2 = (ulong)input | 0x8000000000000000;
        }
      }
      else {
        uVar2 = 0;
      }
    }
  }
  else {
    uVar2 = 0x8000000000000000;
  }
  *(ulong *)result =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  return 8;
}

Assistant:

static idx_t Encode(data_ptr_t result, TYPE input) {
		Radix::EncodeData<T>(result, input);
		return sizeof(T);
	}